

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

string * cfd::core::DescriptorKeyInfo::GetExtPubkeyInformation
                   (string *__return_storage_ptr__,ExtPubkey *ext_pubkey,string *child_path)

{
  char *pcVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  ByteData local_60;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = ExtPubkey::IsValid(ext_pubkey);
  if (bVar2) {
    ExtPubkey::GetFingerprintData(&local_60,ext_pubkey);
    ByteData::GetHex_abi_cxx11_(&local_48,&local_60);
    plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x5bdffb);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_70 = *plVar4;
      lStack_68 = plVar3[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar4;
      local_80 = (long *)*plVar3;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (child_path->_M_string_length != 0) {
      pcVar1 = (child_path->_M_dataplus)._M_p;
      if (pcVar1[(*pcVar1 + 0xb3U & 0xdf) == 0] != '/') {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::substr((ulong)&local_80,(ulong)child_path);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorKeyInfo::GetExtPubkeyInformation(
    const ExtPubkey& ext_pubkey, const std::string& child_path) {
  std::string result;
  if (ext_pubkey.IsValid()) {
    result = "[" + ext_pubkey.GetFingerprintData().GetHex();
    if (!child_path.empty()) {
      std::string::size_type index = 0;
      if ((child_path[0] == 'm') || (child_path[0] == 'M')) ++index;
      if (child_path[index] != '/') {
        result += "/";
      }
      result += child_path.substr(index);
    }
    result += "]";
  }
  return result;
}